

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O1

void __thiscall
mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::erase
          (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_> *this,
          gc_heap_ptr_untracked<mjs::object,_false> *elem)

{
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::gc_table,_true>
  *this_00;
  gc_table *pgVar1;
  gc_table *pgVar2;
  
  this_00 = &this->table_;
  pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::gc_table,_true>
           ::dereference(this_00,this->heap_);
  if (pgVar1 + 1 <= elem) {
    pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::gc_table,_true>
             ::dereference(this_00,this->heap_);
    pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::gc_table,_true>
             ::dereference(this_00,this->heap_);
    if (elem < (gc_heap_ptr_untracked<mjs::object,_false> *)
               ((long)&pgVar1[1].heap_ + (ulong)pgVar2->length_ * 4)) {
      pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::gc_table,_true>
               ::dereference(this_00,this->heap_);
      pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::gc_table,_true>
               ::dereference(this_00,this->heap_);
      gc_table::erase(pgVar2,(uint32_t)((ulong)((long)elem + (-0x10 - (long)pgVar1)) >> 2));
      return;
    }
  }
  __assert_fail("elem >= begin() && elem < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x3a,
                "void mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object, false>>::erase(T *) [T = mjs::gc_heap_ptr_untracked<mjs::object, false>]"
               );
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }